

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O0

void pp_tree_rb_balance_remove(PTreeRBNode *node,PTreeBaseNode **root)

{
  pboolean pVar1;
  PTreeRBNode *local_20;
  PTreeRBNode *sibling;
  PTreeBaseNode **root_local;
  PTreeRBNode *node_local;
  
  root_local = (PTreeBaseNode **)node;
  while( true ) {
    if (root_local[4] == (PTreeBaseNode *)0x0) {
      return;
    }
    local_20 = pp_tree_rb_get_sibling((PTreeRBNode *)root_local);
    pVar1 = pp_tree_rb_is_red(local_20);
    if (pVar1 == 1) {
      *(undefined4 *)&root_local[4][1].right = 1;
      local_20->color = P_TREE_RB_COLOR_BLACK;
      if ((PTreeBaseNode_ *)root_local == root_local[4]->left) {
        pp_tree_rb_rotate_left((PTreeRBNode *)root_local[4],root);
      }
      else {
        pp_tree_rb_rotate_right((PTreeRBNode *)root_local[4],root);
      }
      local_20 = pp_tree_rb_get_sibling((PTreeRBNode *)root_local);
    }
    pVar1 = pp_tree_rb_is_black((PTreeRBNode *)(local_20->base).left);
    if ((pVar1 != 1) ||
       (pVar1 = pp_tree_rb_is_black((PTreeRBNode *)(local_20->base).right), pVar1 != 1)) break;
    local_20->color = P_TREE_RB_COLOR_RED;
    pVar1 = pp_tree_rb_is_black((PTreeRBNode *)root_local[4]);
    if (pVar1 != 1) {
      *(undefined4 *)&root_local[4][1].right = 2;
      return;
    }
    root_local = &root_local[4]->left;
  }
  if (((PTreeBaseNode_ *)root_local == root_local[4]->left) &&
     (pVar1 = pp_tree_rb_is_black((PTreeRBNode *)(local_20->base).right), pVar1 == 1)) {
    local_20->color = P_TREE_RB_COLOR_RED;
    *(undefined4 *)&(local_20->base).left[1].right = 2;
    pp_tree_rb_rotate_right(local_20,root);
    local_20 = pp_tree_rb_get_sibling((PTreeRBNode *)root_local);
  }
  else if (((PTreeBaseNode_ *)root_local == root_local[4]->right) &&
          (pVar1 = pp_tree_rb_is_black((PTreeRBNode *)(local_20->base).left), pVar1 == 1)) {
    local_20->color = P_TREE_RB_COLOR_RED;
    *(undefined4 *)&(local_20->base).right[1].right = 2;
    pp_tree_rb_rotate_left(local_20,root);
    local_20 = pp_tree_rb_get_sibling((PTreeRBNode *)root_local);
  }
  local_20->color = *(PTreeRBColor *)&root_local[4][1].right;
  *(undefined4 *)&root_local[4][1].right = 2;
  if ((PTreeBaseNode_ *)root_local == root_local[4]->left) {
    *(undefined4 *)&(local_20->base).right[1].right = 2;
    pp_tree_rb_rotate_left((PTreeRBNode *)root_local[4],root);
    return;
  }
  *(undefined4 *)&(local_20->base).left[1].right = 2;
  pp_tree_rb_rotate_right((PTreeRBNode *)root_local[4],root);
  return;
}

Assistant:

static void
pp_tree_rb_balance_remove (PTreeRBNode *node, PTreeBaseNode **root)
{
	PTreeRBNode *sibling;

	while (TRUE) {
		/* Case 1: We are at the root */
		if (P_UNLIKELY (node->parent == NULL))
			break;

		sibling = pp_tree_rb_get_sibling (node);

		if (pp_tree_rb_is_red (sibling) == TRUE) {
			/*
			 * Case 2: Left (right) rotate at parent
			 *
			 *     P               S
			 *    / \             / \
			 *   N   s    -->    p   Sr
			 *      / \         / \
			 *     Sl  Sr      N   Sl
			 */
			node->parent->color = P_TREE_RB_COLOR_RED;
			sibling->color      = P_TREE_RB_COLOR_BLACK;

			if ((PTreeBaseNode *) node == node->parent->base.left)
				pp_tree_rb_rotate_left (node->parent, root);
			else
				pp_tree_rb_rotate_right (node->parent, root);

			sibling = pp_tree_rb_get_sibling (node);
		}

		/*
		 * Case 3: Sibling (parent) color flip
		 *
		 *    (p)           (p)
		 *    / \           / \
		 *   N   S    -->  N   s
		 *      / \           / \
		 *     Sl  Sr        Sl  Sr
		 */
		if (pp_tree_rb_is_black ((PTreeRBNode *) sibling->base.left)  == TRUE &&
		    pp_tree_rb_is_black ((PTreeRBNode *) sibling->base.right) == TRUE) {
			sibling->color = P_TREE_RB_COLOR_RED;

			if (pp_tree_rb_is_black (node->parent) == TRUE) {
				node = node->parent;
				continue;
			} else {
				node->parent->color = P_TREE_RB_COLOR_BLACK;
				break;
			}
		}

		/*
		 * Case 4: Right (left) rotate at sibling
		 *
		 *   (p)           (p)
		 *   / \           / \
		 *  N   S    -->  N   Sl
		 *     / \             \
		 *    sl  Sr            s
		 *                       \
		 *                        Sr
		 */
		if ((PTreeBaseNode *) node == node->parent->base.left &&
		    pp_tree_rb_is_black ((PTreeRBNode *) sibling->base.right) == TRUE) {
			sibling->color = P_TREE_RB_COLOR_RED;
			((PTreeRBNode *) sibling->base.left)->color = P_TREE_RB_COLOR_BLACK;

			pp_tree_rb_rotate_right (sibling, root);

			sibling = pp_tree_rb_get_sibling (node);
		} else if ((PTreeBaseNode *) node == node->parent->base.right &&
			   pp_tree_rb_is_black ((PTreeRBNode *) sibling->base.left) == TRUE) {
			sibling->color = P_TREE_RB_COLOR_RED;
			((PTreeRBNode *) sibling->base.right)->color = P_TREE_RB_COLOR_BLACK;

			pp_tree_rb_rotate_left (sibling, root);

			sibling = pp_tree_rb_get_sibling (node);
		}

		/*
		 * Case 5: Left (right) rotate at parent and color flips
		 *
		 *      (p)             (s)
		 *      / \             / \
		 *     N   S     -->   P   Sr
		 *        / \         / \
		 *      (sl) sr      N  (sl)
		 */
		sibling->color      = node->parent->color;
		node->parent->color = P_TREE_RB_COLOR_BLACK;

		if ((PTreeBaseNode *) node == node->parent->base.left) {
			((PTreeRBNode *) sibling->base.right)->color = P_TREE_RB_COLOR_BLACK;
			pp_tree_rb_rotate_left (node->parent, root);
		} else {
			((PTreeRBNode *) sibling->base.left)->color = P_TREE_RB_COLOR_BLACK;
			pp_tree_rb_rotate_right (node->parent, root);
		}

		break;
	}
}